

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O3

void __thiscall DElevator::DElevator(DElevator *this,sector_t_conflict *sec)

{
  DInterpolation *pDVar1;
  
  DMover::DMover(&this->super_DMover,sec);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f8e50;
  (sec->floordata).field_0.p = (DSectorEffect *)this;
  (sec->ceilingdata).field_0.p = (DSectorEffect *)this;
  pDVar1 = sector_t::SetInterpolation((sector_t *)sec,1,true);
  (this->m_Interp_Floor).field_0.p = pDVar1;
  pDVar1 = sector_t::SetInterpolation((sector_t *)sec,0,true);
  (this->m_Interp_Ceiling).field_0.p = pDVar1;
  return;
}

Assistant:

DElevator::DElevator (sector_t *sec)
	: Super (sec)
{
	sec->floordata = this;
	sec->ceilingdata = this;
	m_Interp_Floor = sec->SetInterpolation(sector_t::FloorMove, true);
	m_Interp_Ceiling = sec->SetInterpolation(sector_t::CeilingMove, true);
}